

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

GeneratorTracker *
Catch::Generators::GeneratorTracker::acquire(TrackerContext *ctx,NameAndLocation *nameAndLocation)

{
  ITracker *pIVar1;
  undefined1 uVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  NameAndLocation *__args;
  undefined4 extraout_var;
  element_type *peVar6;
  int __oflag;
  undefined8 in_RSI;
  char *__file;
  TrackerContext *in_RDI;
  ITrackerPtr childTracker;
  ITrackerPtr thisTracker;
  ITracker *currentTracker;
  shared_ptr<Catch::Generators::GeneratorTracker> tracker;
  NameAndLocation *in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  shared_ptr<Catch::TestCaseTracking::ITracker> *in_stack_ffffffffffffff28;
  ITracker **in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  char local_a0 [16];
  ITracker *local_90;
  char local_78 [16];
  __shared_ptr local_68 [16];
  char local_58 [16];
  undefined1 local_48 [32];
  ITracker *local_28;
  undefined8 local_10;
  TrackerContext *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  clara::std::shared_ptr<Catch::Generators::GeneratorTracker>::shared_ptr
            ((shared_ptr<Catch::Generators::GeneratorTracker> *)0x15d234);
  local_28 = TestCaseTracking::TrackerContext::currentTracker(local_8);
  __args = TestCaseTracking::ITracker::nameAndLocation(local_28);
  uVar2 = TestCaseTracking::operator==
                    ((NameAndLocation *)
                     CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                     in_stack_ffffffffffffff18);
  if ((bool)uVar2) {
    iVar4 = (*local_28->_vptr_ITracker[7])();
    (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x60))
              (local_48,(long *)CONCAT44(extraout_var,iVar4),local_10);
    std::static_pointer_cast<Catch::Generators::GeneratorTracker,Catch::TestCaseTracking::ITracker>
              (in_stack_ffffffffffffff28);
    __file = local_58;
    clara::std::shared_ptr<Catch::Generators::GeneratorTracker>::operator=
              ((shared_ptr<Catch::Generators::GeneratorTracker> *)
               CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
               (shared_ptr<Catch::Generators::GeneratorTracker> *)in_stack_ffffffffffffff18);
    clara::std::shared_ptr<Catch::Generators::GeneratorTracker>::~shared_ptr
              ((shared_ptr<Catch::Generators::GeneratorTracker> *)0x15d2f1);
    clara::std::shared_ptr<Catch::TestCaseTracking::ITracker>::~shared_ptr
              ((shared_ptr<Catch::TestCaseTracking::ITracker> *)0x15d2fe);
  }
  else {
    (*local_28->_vptr_ITracker[0xc])(local_68,local_28,local_10);
    bVar3 = std::__shared_ptr::operator_cast_to_bool(local_68);
    if (bVar3) {
      std::
      static_pointer_cast<Catch::Generators::GeneratorTracker,Catch::TestCaseTracking::ITracker>
                (in_stack_ffffffffffffff28);
      __file = local_78;
      clara::std::shared_ptr<Catch::Generators::GeneratorTracker>::operator=
                ((shared_ptr<Catch::Generators::GeneratorTracker> *)
                 CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                 (shared_ptr<Catch::Generators::GeneratorTracker> *)in_stack_ffffffffffffff18);
      clara::std::shared_ptr<Catch::Generators::GeneratorTracker>::~shared_ptr
                ((shared_ptr<Catch::Generators::GeneratorTracker> *)0x15d380);
    }
    else {
      local_90 = local_28;
      std::
      make_shared<Catch::Generators::GeneratorTracker,Catch::TestCaseTracking::NameAndLocation_const&,Catch::TestCaseTracking::TrackerContext&,Catch::TestCaseTracking::ITracker*>
                (__args,(TrackerContext *)CONCAT17(uVar2,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff48);
      clara::std::shared_ptr<Catch::Generators::GeneratorTracker>::operator=
                ((shared_ptr<Catch::Generators::GeneratorTracker> *)
                 CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                 (shared_ptr<Catch::Generators::GeneratorTracker> *)in_stack_ffffffffffffff18);
      clara::std::shared_ptr<Catch::Generators::GeneratorTracker>::~shared_ptr
                ((shared_ptr<Catch::Generators::GeneratorTracker> *)0x15d3d9);
      pIVar1 = local_28;
      __file = local_a0;
      std::shared_ptr<Catch::TestCaseTracking::ITracker>::
      shared_ptr<Catch::Generators::GeneratorTracker,void>
                ((shared_ptr<Catch::TestCaseTracking::ITracker> *)
                 CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                 (shared_ptr<Catch::Generators::GeneratorTracker> *)in_stack_ffffffffffffff18);
      (*pIVar1->_vptr_ITracker[0xb])();
      clara::std::shared_ptr<Catch::TestCaseTracking::ITracker>::~shared_ptr
                ((shared_ptr<Catch::TestCaseTracking::ITracker> *)0x15d419);
    }
    clara::std::shared_ptr<Catch::TestCaseTracking::ITracker>::~shared_ptr
              ((shared_ptr<Catch::TestCaseTracking::ITracker> *)0x15d45e);
  }
  peVar6 = clara::std::
           __shared_ptr_access<Catch::Generators::GeneratorTracker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Catch::Generators::GeneratorTracker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x15d47c);
  uVar5 = (*(peVar6->super_TrackerBase).super_ITracker._vptr_ITracker[2])();
  uVar2 = (undefined1)uVar5;
  if ((uVar5 & 1) == 0) {
    peVar6 = clara::std::
             __shared_ptr_access<Catch::Generators::GeneratorTracker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Catch::Generators::GeneratorTracker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x15d4a5);
    TestCaseTracking::TrackerBase::open(&peVar6->super_TrackerBase,__file,__oflag);
  }
  peVar6 = clara::std::
           __shared_ptr_access<Catch::Generators::GeneratorTracker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<Catch::Generators::GeneratorTracker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)CONCAT17(uVar2,in_stack_ffffffffffffff20));
  clara::std::shared_ptr<Catch::Generators::GeneratorTracker>::~shared_ptr
            ((shared_ptr<Catch::Generators::GeneratorTracker> *)0x15d4cf);
  return peVar6;
}

Assistant:

static GeneratorTracker& acquire( TrackerContext& ctx, TestCaseTracking::NameAndLocation const& nameAndLocation ) {
                std::shared_ptr<GeneratorTracker> tracker;

                ITracker& currentTracker = ctx.currentTracker();
                // Under specific circumstances, the generator we want
                // to acquire is also the current tracker. If this is
                // the case, we have to avoid looking through current
                // tracker's children, and instead return the current
                // tracker.
                // A case where this check is important is e.g.
                //     for (int i = 0; i < 5; ++i) {
                //         int n = GENERATE(1, 2);
                //     }
                //
                // without it, the code above creates 5 nested generators.
                if (currentTracker.nameAndLocation() == nameAndLocation) {
                    auto thisTracker = currentTracker.parent().findChild(nameAndLocation);
                    assert(thisTracker);
                    assert(thisTracker->isGeneratorTracker());
                    tracker = std::static_pointer_cast<GeneratorTracker>(thisTracker);
                } else if ( TestCaseTracking::ITrackerPtr childTracker = currentTracker.findChild( nameAndLocation ) ) {
                    assert( childTracker );
                    assert( childTracker->isGeneratorTracker() );
                    tracker = std::static_pointer_cast<GeneratorTracker>( childTracker );
                } else {
                    tracker = std::make_shared<GeneratorTracker>( nameAndLocation, ctx, &currentTracker );
                    currentTracker.addChild( tracker );
                }

                if( !tracker->isComplete() ) {
                    tracker->open();
                }

                return *tracker;
            }